

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDefinitions.cxx
# Opt level: O3

bool cmDefinitions::HasKey(string *key,StackConstIter *begin,StackConstIter *end)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  const_iterator cVar3;
  _List_node_base *p_Var4;
  
  p_Var2 = (begin->current)._M_node;
  do {
    p_Var4 = p_Var2;
    p_Var1 = (end->current)._M_node;
    if (p_Var4 == p_Var1) break;
    cVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)(p_Var4->_M_prev + 1),key);
    p_Var2 = p_Var4->_M_prev;
  } while (cVar3.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_true>
           ._M_cur == (__node_type *)0x0);
  return p_Var4 != p_Var1;
}

Assistant:

bool cmDefinitions::HasKey(const std::string& key,
                           StackConstIter begin, StackConstIter end)
{
  for (StackConstIter it = begin; it != end; ++it)
    {
    MapType::const_iterator i = it->Map.find(key);
    if (i != it->Map.end())
      {
      return true;
      }
    }
  return false;
}